

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_atan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_atan op;
  Mat *m;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_a8;
  __m128 magic_a7;
  __m128 magic_a6;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_half_pi;
  __m128 magic_negative_one;
  __m128 magic_one;
  __m128 magic_negative_zero;
  ulong local_a28;
  ulong uStack_a20;
  int local_a14;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined4 local_9f8;
  long local_9f0;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined8 local_9d0;
  float *local_9c8;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  undefined1 local_9a1 [9];
  long *local_998;
  undefined1 local_98d;
  int local_98c;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined8 *local_968;
  float *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  float *local_948;
  long local_940;
  undefined4 local_934;
  long local_930;
  float *local_928;
  undefined4 local_91c;
  int local_918;
  int local_914;
  undefined8 *local_910;
  undefined4 local_904;
  long local_900;
  undefined8 *local_8f0;
  ulong *local_8c8;
  undefined1 *local_8c0;
  float *local_8b8;
  undefined1 *local_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  ulong local_6d8;
  ulong uStack_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  ulong local_688;
  ulong uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined4 local_65c;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  uint local_588;
  uint uStack_584;
  uint uStack_580;
  uint uStack_57c;
  ulong local_578;
  ulong uStack_570;
  ulong local_568;
  ulong uStack_560;
  ulong local_558;
  ulong uStack_550;
  undefined4 local_548;
  undefined4 uStack_544;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  undefined4 local_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float *local_320;
  float *local_318;
  float *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c0;
  float *local_2b8;
  float *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 *local_260;
  float *local_258;
  float *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 *local_200;
  float *local_1f8;
  float *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  undefined8 *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 *local_140;
  float *local_138;
  float *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 *local_e0;
  float *local_d8;
  float *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 *local_80;
  undefined8 *local_78;
  float *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_9a8 = *(int *)((long)in_RDI + 0x2c);
  local_9ac = (int)in_RDI[6];
  local_9b0 = *(int *)((long)in_RDI + 0x34);
  local_9b4 = (int)in_RDI[7];
  local_9b8 = (int)in_RDI[3];
  local_9bc = local_9a8 * local_9ac * local_9b0 * local_9b8;
  local_998 = in_RDI;
  for (local_9c0 = 0; local_9c0 < local_9b4; local_9c0 = local_9c0 + 1) {
    local_980 = &local_a10;
    local_914 = *(int *)((long)local_998 + 0x2c);
    local_918 = (int)local_998[6];
    local_91c = *(undefined4 *)((long)local_998 + 0x34);
    local_928 = (float *)(*local_998 + local_998[8] * (long)local_9c0 * local_998[2]);
    local_930 = local_998[2];
    local_934 = (undefined4)local_998[3];
    local_940 = local_998[4];
    local_910 = &local_a10;
    local_900 = (long)local_914 * (long)local_918 * local_930;
    local_978 = &local_a10;
    local_968 = &local_a10;
    local_904 = 0x10;
    local_98c = local_9c0;
    local_98d = 1;
    local_a10 = 0;
    local_a00 = 0;
    local_9f8 = 0;
    local_9e8 = 0;
    local_9e4 = 0;
    local_9e0 = 0;
    local_9dc = 0;
    local_9d8 = 0;
    local_9d0 = 0;
    local_a08 = 0;
    local_9c8 = local_928;
    for (local_a14 = 0; local_8f0 = local_968, local_9f0 = local_940, local_a14 + 3 < local_9bc;
        local_a14 = local_a14 + 4) {
      local_960 = local_9c8;
      local_6f8 = *(ulong *)local_9c8;
      uStack_6f0 = *(ulong *)(local_9c8 + 2);
      local_8c0 = local_9a1;
      local_8c8 = &local_a28;
      local_62c = 0x80000000;
      local_52c = 0x80000000;
      local_548 = 0x80000000;
      local_708 = 0x8000000080000000;
      uStack_700 = 0x8000000080000000;
      local_630 = 0x3f800000;
      local_50c = 0x3f800000;
      local_528 = 0x3f800000;
      local_718 = 0x3f8000003f800000;
      uStack_710 = 0x3f8000003f800000;
      local_634 = 0xbf800000;
      local_4ec = 0xbf800000;
      local_508 = 0xbf800000;
      local_728 = 0xbf800000bf800000;
      uStack_720 = 0xbf800000bf800000;
      local_638 = 0x3fc90fdb;
      local_4cc = 0x3fc90fdb;
      local_4e8 = 0x3fc90fdb;
      local_738 = 0x3fc90fdb3fc90fdb;
      uStack_730 = 0x3fc90fdb3fc90fdb;
      local_63c = 0x3f800000;
      local_4ac = 0x3f800000;
      local_4c8 = 0x3f800000;
      local_748 = 0x3f8000003f800000;
      uStack_740 = 0x3f8000003f800000;
      local_640 = 0xbeaaaa53;
      local_48c = 0xbeaaaa53;
      local_4a8 = 0xbeaaaa53;
      local_758 = 0xbeaaaa53beaaaa53;
      uStack_750 = 0xbeaaaa53beaaaa53;
      local_644 = 0x3e4cb974;
      local_46c = 0x3e4cb974;
      local_488 = 0x3e4cb974;
      local_768 = 0x3e4cb9743e4cb974;
      uStack_760 = 0x3e4cb9743e4cb974;
      local_648 = 0xbe117200;
      local_44c = 0xbe117200;
      local_468 = 0xbe117200;
      local_778 = 0xbe117200be117200;
      uStack_770 = 0xbe117200be117200;
      local_64c = 0x3dd9ed24;
      local_42c = 0x3dd9ed24;
      local_448 = 0x3dd9ed24;
      local_788 = 0x3dd9ed243dd9ed24;
      uStack_780 = 0x3dd9ed243dd9ed24;
      local_650 = 0xbd99b01e;
      local_40c = 0xbd99b01e;
      local_428 = 0xbd99b01e;
      local_798 = 0xbd99b01ebd99b01e;
      uStack_790 = 0xbd99b01ebd99b01e;
      local_654 = 0x3d2edd4e;
      local_3ec = 0x3d2edd4e;
      local_408 = 0x3d2edd4e;
      local_7a8 = 0x3d2edd4e3d2edd4e;
      uStack_7a0 = 0x3d2edd4e3d2edd4e;
      local_658 = 0xbc83a25c;
      local_3cc = 0xbc83a25c;
      local_3e8 = 0xbc83a25c;
      local_7b8 = 0xbc83a25cbc83a25c;
      uStack_7b0 = 0xbc83a25cbc83a25c;
      local_65c = 0x3b3ac537;
      local_3ac = 0x3b3ac537;
      local_3c8 = 0x3b3ac537;
      local_7c8 = 0x3b3ac5373b3ac537;
      uStack_7c0 = 0x3b3ac5373b3ac537;
      local_7d8 = local_6f8 & 0x8000000080000000;
      uStack_7d0 = uStack_6f0 & 0x8000000080000000;
      local_7e8 = local_6f8 & 0x7fffffff7fffffff;
      uStack_7e0 = uStack_6f0 & 0x7fffffff7fffffff;
      local_5c8._0_4_ = (float)local_7e8;
      local_5c8._4_4_ = (float)(local_7e8 >> 0x20);
      uStack_5c0._0_4_ = (float)uStack_7e0;
      uStack_5c0._4_4_ = (float)(uStack_7e0 >> 0x20);
      local_7f8 = -(uint)(1.0 < (float)local_5c8);
      uStack_7f4 = -(uint)(1.0 < local_5c8._4_4_);
      uStack_7f0 = -(uint)(1.0 < (float)uStack_5c0);
      uStack_7ec = -(uint)(1.0 < uStack_5c0._4_4_);
      local_698 = CONCAT44(uStack_7f4,local_7f8);
      uStack_690 = CONCAT44(uStack_7ec,uStack_7f0);
      local_558 = local_698 & 0xbf800000bf800000;
      uStack_550 = uStack_690 & 0xbf800000bf800000;
      local_5f8 = CONCAT44(uStack_7f4,local_7f8);
      uStack_5f0 = CONCAT44(uStack_7ec,uStack_7f0);
      local_568 = ~local_5f8 & local_7e8;
      uStack_560 = ~uStack_5f0 & uStack_7e0;
      local_18 = local_558 | local_568;
      uStack_10 = uStack_550 | uStack_560;
      local_6b8 = CONCAT44(uStack_7f4,local_7f8);
      uStack_6b0 = CONCAT44(uStack_7ec,uStack_7f0);
      local_578 = local_6b8 & local_7e8;
      uStack_570 = uStack_6b0 & uStack_7e0;
      local_618 = CONCAT44(uStack_7f4,local_7f8);
      uStack_610 = CONCAT44(uStack_7ec,uStack_7f0);
      local_588 = (local_7f8 ^ 0xffffffff) & 0x3f800000;
      uStack_584 = (uStack_7f4 ^ 0xffffffff) & 0x3f800000;
      uStack_580 = (uStack_7f0 ^ 0xffffffff) & 0x3f800000;
      uStack_57c = (uStack_7ec ^ 0xffffffff) & 0x3f800000;
      local_28 = local_578 |
                 ((CONCAT44(uStack_7f4,local_7f8) ^ 0xffffffff) & 0xffffffff3f800000 ^
                 0xffffffff00000000) & 0x3f800000ffffffff;
      uStack_20 = uStack_570 |
                  ((CONCAT44(uStack_7ec,uStack_7f0) ^ 0xffffffff) & 0xffffffff3f800000 ^
                  0xffffffff00000000) & 0x3f800000ffffffff;
      auVar2._8_8_ = uStack_10;
      auVar2._0_8_ = local_18;
      auVar1._8_8_ = uStack_20;
      auVar1._0_8_ = local_28;
      local_808 = divps(auVar2,auVar1);
      local_368 = local_808._0_8_;
      uStack_360 = local_808._8_8_;
      local_358._0_4_ = local_808._0_4_;
      local_358._4_4_ = local_808._4_4_;
      uStack_350._0_4_ = local_808._8_4_;
      uStack_350._4_4_ = local_808._12_4_;
      local_818 = (float)local_358 * (float)local_358;
      fStack_814 = local_358._4_4_ * local_358._4_4_;
      fStack_810 = (float)uStack_350 * (float)uStack_350;
      fStack_80c = uStack_350._4_4_ * uStack_350._4_4_;
      local_378 = CONCAT44(fStack_814,local_818);
      uStack_370 = CONCAT44(fStack_80c,fStack_810);
      local_388 = CONCAT44(fStack_814,local_818);
      uStack_380 = CONCAT44(fStack_80c,fStack_810);
      local_828 = local_818 * local_818;
      fStack_824 = fStack_814 * fStack_814;
      fStack_820 = fStack_810 * fStack_810;
      fStack_81c = fStack_80c * fStack_80c;
      local_70 = &local_828;
      local_78 = &local_7b8;
      local_80 = &local_798;
      local_58 = CONCAT44(fStack_824,local_828);
      uStack_50 = CONCAT44(fStack_81c,fStack_820);
      local_68 = 0xbc83a25cbc83a25c;
      uStack_60 = 0xbc83a25cbc83a25c;
      local_38 = local_828 * -0.01606863;
      fStack_34 = fStack_824 * -0.01606863;
      fStack_30 = fStack_820 * -0.01606863;
      fStack_2c = fStack_81c * -0.01606863;
      local_48 = 0xbd99b01ebd99b01e;
      uStack_40 = 0xbd99b01ebd99b01e;
      local_868 = local_38 + -0.07504295;
      fStack_864 = fStack_34 + -0.07504295;
      fStack_860 = fStack_30 + -0.07504295;
      fStack_85c = fStack_2c + -0.07504295;
      local_d0 = &local_828;
      local_d8 = &local_868;
      local_e0 = &local_778;
      local_b8 = CONCAT44(fStack_824,local_828);
      uStack_b0 = CONCAT44(fStack_81c,fStack_820);
      local_c8 = CONCAT44(fStack_864,local_868);
      uStack_c0 = CONCAT44(fStack_85c,fStack_860);
      local_98 = local_828 * local_868;
      fStack_94 = fStack_824 * fStack_864;
      fStack_90 = fStack_820 * fStack_860;
      fStack_8c = fStack_81c * fStack_85c;
      local_a8 = 0xbe117200be117200;
      uStack_a0 = 0xbe117200be117200;
      local_858 = local_98 + -0.14203644;
      fStack_854 = fStack_94 + -0.14203644;
      fStack_850 = fStack_90 + -0.14203644;
      fStack_84c = fStack_8c + -0.14203644;
      local_130 = &local_828;
      local_138 = &local_858;
      local_140 = &local_758;
      local_118 = CONCAT44(fStack_824,local_828);
      uStack_110 = CONCAT44(fStack_81c,fStack_820);
      local_128 = CONCAT44(fStack_854,local_858);
      uStack_120 = CONCAT44(fStack_84c,fStack_850);
      local_f8 = local_828 * local_858;
      fStack_f4 = fStack_824 * fStack_854;
      fStack_f0 = fStack_820 * fStack_850;
      fStack_ec = fStack_81c * fStack_84c;
      local_108 = 0xbeaaaa53beaaaa53;
      uStack_100 = 0xbeaaaa53beaaaa53;
      local_848 = local_f8 + -0.33333072;
      fStack_844 = fStack_f4 + -0.33333072;
      fStack_840 = fStack_f0 + -0.33333072;
      fStack_83c = fStack_ec + -0.33333072;
      local_190 = &local_828;
      local_198 = &local_7c8;
      local_1a0 = &local_7a8;
      local_178 = CONCAT44(fStack_824,local_828);
      uStack_170 = CONCAT44(fStack_81c,fStack_820);
      local_188 = 0x3b3ac5373b3ac537;
      uStack_180 = 0x3b3ac5373b3ac537;
      local_158 = local_828 * 0.0028498897;
      fStack_154 = fStack_824 * 0.0028498897;
      fStack_150 = fStack_820 * 0.0028498897;
      fStack_14c = fStack_81c * 0.0028498897;
      local_168 = 0x3d2edd4e3d2edd4e;
      uStack_160 = 0x3d2edd4e3d2edd4e;
      local_8a8 = local_158 + 0.04269152;
      fStack_8a4 = fStack_154 + 0.04269152;
      fStack_8a0 = fStack_150 + 0.04269152;
      fStack_89c = fStack_14c + 0.04269152;
      local_1f0 = &local_828;
      local_1f8 = &local_8a8;
      local_200 = &local_788;
      local_1d8 = CONCAT44(fStack_824,local_828);
      uStack_1d0 = CONCAT44(fStack_81c,fStack_820);
      local_1e8 = CONCAT44(fStack_8a4,local_8a8);
      uStack_1e0 = CONCAT44(fStack_89c,fStack_8a0);
      local_1b8 = local_828 * local_8a8;
      fStack_1b4 = fStack_824 * fStack_8a4;
      fStack_1b0 = fStack_820 * fStack_8a0;
      fStack_1ac = fStack_81c * fStack_89c;
      local_1c8 = 0x3dd9ed243dd9ed24;
      uStack_1c0 = 0x3dd9ed243dd9ed24;
      local_898 = local_1b8 + 0.10640934;
      fStack_894 = fStack_1b4 + 0.10640934;
      fStack_890 = fStack_1b0 + 0.10640934;
      fStack_88c = fStack_1ac + 0.10640934;
      local_250 = &local_828;
      local_258 = &local_898;
      local_260 = &local_768;
      local_238 = CONCAT44(fStack_824,local_828);
      uStack_230 = CONCAT44(fStack_81c,fStack_820);
      local_248 = CONCAT44(fStack_894,local_898);
      uStack_240 = CONCAT44(fStack_88c,fStack_890);
      local_218 = local_828 * local_898;
      fStack_214 = fStack_824 * fStack_894;
      fStack_210 = fStack_820 * fStack_890;
      fStack_20c = fStack_81c * fStack_88c;
      local_228 = 0x3e4cb9743e4cb974;
      uStack_220 = 0x3e4cb9743e4cb974;
      local_888 = local_218 + 0.1999262;
      fStack_884 = fStack_214 + 0.1999262;
      fStack_880 = fStack_210 + 0.1999262;
      fStack_87c = fStack_20c + 0.1999262;
      local_2b0 = &local_828;
      local_2b8 = &local_888;
      local_2c0 = &local_748;
      local_298 = CONCAT44(fStack_824,local_828);
      uStack_290 = CONCAT44(fStack_81c,fStack_820);
      local_2a8 = CONCAT44(fStack_884,local_888);
      uStack_2a0 = CONCAT44(fStack_87c,fStack_880);
      local_278 = local_828 * local_888;
      fStack_274 = fStack_824 * fStack_884;
      fStack_270 = fStack_820 * fStack_880;
      fStack_26c = fStack_81c * fStack_87c;
      local_288 = 0x3f8000003f800000;
      uStack_280 = 0x3f8000003f800000;
      local_878 = local_278 + 1.0;
      fStack_874 = fStack_274 + 1.0;
      fStack_870 = fStack_270 + 1.0;
      fStack_86c = fStack_26c + 1.0;
      local_310 = &local_818;
      local_318 = &local_848;
      local_320 = &local_878;
      local_2f8 = CONCAT44(fStack_814,local_818);
      uStack_2f0 = CONCAT44(fStack_80c,fStack_810);
      local_308 = CONCAT44(fStack_844,local_848);
      uStack_300 = CONCAT44(fStack_83c,fStack_840);
      local_2d8 = local_818 * local_848;
      fStack_2d4 = fStack_814 * fStack_844;
      fStack_2d0 = fStack_810 * fStack_840;
      fStack_2cc = fStack_80c * fStack_83c;
      local_2e8 = CONCAT44(fStack_874,local_878);
      uStack_2e0 = CONCAT44(fStack_86c,fStack_870);
      local_838 = local_2d8 + local_878;
      fStack_834 = fStack_2d4 + fStack_874;
      fStack_830 = fStack_2d0 + fStack_870;
      fStack_82c = fStack_2cc + fStack_86c;
      local_398 = CONCAT44(fStack_834,local_838);
      uStack_390 = CONCAT44(fStack_82c,fStack_830);
      local_3a8 = local_808._0_8_;
      uStack_3a0 = local_808._8_8_;
      local_338 = local_838 * (float)local_358;
      fStack_334 = fStack_834 * local_358._4_4_;
      fStack_330 = fStack_830 * (float)uStack_350;
      fStack_32c = fStack_82c * uStack_350._4_4_;
      local_6d8 = CONCAT44(uStack_7f4,local_7f8);
      uStack_6d0 = CONCAT44(uStack_7ec,uStack_7f0);
      uVar4 = local_6d8 & 0x3fc90fdb3fc90fdb;
      uVar5 = uStack_6d0 & 0x3fc90fdb3fc90fdb;
      local_348._0_4_ = (float)uVar4;
      local_348._4_4_ = (float)(uVar4 >> 0x20);
      uStack_340._0_4_ = (float)uVar5;
      uStack_340._4_4_ = (float)(uVar5 >> 0x20);
      local_598 = local_338 + (float)local_348;
      fStack_594 = fStack_334 + local_348._4_4_;
      fStack_590 = fStack_330 + (float)uStack_340;
      fStack_58c = fStack_32c + uStack_340._4_4_;
      local_a28 = CONCAT44(fStack_594,local_598) | local_7d8;
      uStack_a20 = CONCAT44(fStack_58c,fStack_590) | uStack_7d0;
      local_948 = local_9c8;
      local_958._0_4_ = (float)local_a28;
      local_958._4_4_ = (float)(local_a28 >> 0x20);
      uStack_950._0_4_ = (float)uStack_a20;
      uStack_950._4_4_ = (float)(uStack_a20 >> 0x20);
      *local_9c8 = (float)local_958;
      local_9c8[1] = local_958._4_4_;
      local_9c8[2] = (float)uStack_950;
      local_9c8[3] = uStack_950._4_4_;
      local_9c8 = local_9c8 + 4;
      local_958 = local_a28;
      uStack_950 = uStack_a20;
      local_6e8 = local_738;
      uStack_6e0 = uStack_730;
      local_6c8 = local_7e8;
      uStack_6c0 = uStack_7e0;
      local_6a8 = local_728;
      uStack_6a0 = uStack_720;
      local_688 = local_6f8;
      uStack_680 = uStack_6f0;
      local_678 = local_708;
      uStack_670 = uStack_700;
      local_628 = local_718;
      uStack_620 = uStack_710;
      local_608 = local_7e8;
      uStack_600 = uStack_7e0;
      local_5e8 = local_6f8;
      uStack_5e0 = uStack_6f0;
      local_5d8 = local_708;
      uStack_5d0 = uStack_700;
      local_5c8 = local_7e8;
      uStack_5c0 = uStack_7e0;
      local_5b8 = local_718;
      uStack_5b0 = uStack_710;
      local_5a8 = local_7d8;
      uStack_5a0 = uStack_7d0;
      uStack_544 = local_548;
      uStack_540 = local_548;
      uStack_53c = local_548;
      uStack_524 = local_528;
      uStack_520 = local_528;
      uStack_51c = local_528;
      uStack_504 = local_508;
      uStack_500 = local_508;
      uStack_4fc = local_508;
      uStack_4e4 = local_4e8;
      uStack_4e0 = local_4e8;
      uStack_4dc = local_4e8;
      uStack_4c4 = local_4c8;
      uStack_4c0 = local_4c8;
      uStack_4bc = local_4c8;
      uStack_4a4 = local_4a8;
      uStack_4a0 = local_4a8;
      uStack_49c = local_4a8;
      uStack_484 = local_488;
      uStack_480 = local_488;
      uStack_47c = local_488;
      uStack_464 = local_468;
      uStack_460 = local_468;
      uStack_45c = local_468;
      uStack_444 = local_448;
      uStack_440 = local_448;
      uStack_43c = local_448;
      uStack_424 = local_428;
      uStack_420 = local_428;
      uStack_41c = local_428;
      uStack_404 = local_408;
      uStack_400 = local_408;
      uStack_3fc = local_408;
      uStack_3e4 = local_3e8;
      uStack_3e0 = local_3e8;
      uStack_3dc = local_3e8;
      uStack_3c4 = local_3c8;
      uStack_3c0 = local_3c8;
      uStack_3bc = local_3c8;
      local_358 = local_808._0_8_;
      uStack_350 = local_808._8_8_;
      local_348 = uVar4;
      uStack_340 = uVar5;
    }
    for (; local_a14 < local_9bc; local_a14 = local_a14 + 1) {
      local_8b0 = local_9a1;
      local_8b8 = local_9c8;
      fVar3 = atanf(*local_9c8);
      *local_9c8 = fVar3;
      local_9c8 = local_9c8 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}